

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

uint8_t * google::protobuf::internal::PrimitiveTypeHelper<17>::SerializeToArray
                    (void *ptr,uint8_t *buffer)

{
  uint8_t *puVar1;
  
  puVar1 = WireFormatLite::WriteSInt32NoTagToArray(*ptr,buffer);
  return puVar1;
}

Assistant:

static uint8_t* SerializeToArray(const void* ptr, uint8_t* buffer) {
    return WireFormatLite::WriteSInt32NoTagToArray(Get<Type>(ptr), buffer);
  }